

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int wb_write_to_temp(archive_write *a,void *buff,size_t s)

{
  int iVar1;
  uchar *__dest;
  iso9660_conflict *local_48;
  size_t size;
  iso9660_conflict *iso9660;
  size_t xs;
  char *xp;
  size_t s_local;
  void *buff_local;
  archive_write *a_local;
  
  iso9660 = (iso9660_conflict *)s;
  xs = (size_t)buff;
  if ((*(long *)((long)a->format_data + 0x102e0) == 0x10000) && (0x4000 < s)) {
    iso9660 = (iso9660_conflict *)(s & 0x7ff);
    *(size_t *)((long)a->format_data + 0x102f0) =
         (s - (long)iso9660) + *(long *)((long)a->format_data + 0x102f0);
    iVar1 = write_to_temp(a,buff,s - (long)iso9660);
    if (iVar1 != 0) {
      return -0x1e;
    }
    if (iso9660 == (iso9660_conflict *)0x0) {
      return 0;
    }
    xs = (s - (long)iso9660) + (long)buff;
  }
  while( true ) {
    if (iso9660 == (iso9660_conflict *)0x0) {
      return 0;
    }
    local_48 = iso9660;
    if (*(iso9660_conflict **)((long)a->format_data + 0x102e0) < iso9660) {
      local_48 = *(iso9660_conflict **)((long)a->format_data + 0x102e0);
    }
    __dest = wb_buffptr(a);
    memcpy(__dest,(void *)xs,(size_t)local_48);
    iVar1 = wb_consume(a,(size_t)local_48);
    if (iVar1 != 0) break;
    iso9660 = (iso9660_conflict *)((long)iso9660 - (long)local_48);
    xs = (long)&local_48->birth_time + xs;
  }
  return -0x1e;
}

Assistant:

static int
wb_write_to_temp(struct archive_write *a, const void *buff, size_t s)
{
	const char *xp = buff;
	size_t xs = s;

	/*
	 * If a written data size is big enough to use system-call
	 * and there is no waiting data, this calls write_to_temp() in
	 * order to reduce a extra memory copy.
	 */
	if (wb_remaining(a) == wb_buffmax() && s > (1024 * 16)) {
		struct iso9660 *iso9660 = (struct iso9660 *)a->format_data;
		xs = s % LOGICAL_BLOCK_SIZE;
		iso9660->wbuff_offset += s - xs;
		if (write_to_temp(a, buff, s - xs) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		if (xs == 0)
			return (ARCHIVE_OK);
		xp += s - xs;
	}

	while (xs) {
		size_t size = xs;
		if (size > wb_remaining(a))
			size = wb_remaining(a);
		memcpy(wb_buffptr(a), xp, size);
		if (wb_consume(a, size) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		xs -= size;
		xp += size;
	}
	return (ARCHIVE_OK);
}